

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3Codec.cpp
# Opt level: O1

int __thiscall MP3Codec::mp3DecodeFrame(MP3Codec *this,uint8_t *buff,uint8_t *end)

{
  ushort uVar1;
  byte bVar2;
  uint32_t uVar3;
  sbyte sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  
  if ((long)end - (long)buff < 4) {
    return 0;
  }
  uVar3 = my_ntohl(*(uint32_t *)buff);
  uVar5 = 1;
  if ((uVar3 & 0x100000) != 0) {
    uVar5 = (uint)((uVar3 >> 0x13 & 1) == 0);
  }
  bVar2 = (byte)(uVar3 >> 0x11) & 3;
  bVar9 = 4 - bVar2;
  this->m_layer = bVar9;
  if ((uVar3 >> 0x11 & 3) == 0) {
    return 0;
  }
  bVar11 = (byte)(uVar3 >> 10) & 3;
  this->m_sample_rate_index = bVar11;
  if ((~uVar3 & 0xc00) == 0) {
    return 0;
  }
  sVar4 = ((byte)((uVar3 & 0x100000) >> 0x14) ^ 1) + (sbyte)uVar5;
  uVar8 = (uint)(ff_mpa_freq_tab[bVar11] >> sVar4);
  this->m_sample_rate = uVar8;
  this->m_sample_rate_index = sVar4 * '\x03' + bVar11;
  bVar11 = (byte)(uVar3 >> 0xc) & 0xf;
  this->m_bitrate_index = bVar11;
  if ((~uVar3 & 0xf000) == 0) {
    return 0;
  }
  bVar10 = (byte)uVar3 >> 6;
  this->m_mode = bVar10;
  this->m_mode_ext = (byte)uVar3 >> 4 & 3;
  this->m_nb_channels = (bVar10 != 3) + 1;
  if ((uVar3 >> 0xc & 0xf) == 0) {
    return 0;
  }
  uVar7 = uVar3 >> 9 & 1;
  uVar1 = *(ushort *)
           (&UNK_0020d112 +
           (ulong)bVar11 * 2 + (ulong)bVar9 * 0x20 + (ulong)bVar9 * -2 + (ulong)uVar5 * 0x5a);
  this->m_frame_size = (uint)uVar1;
  this->m_bit_rate = (uint)uVar1 * 1000;
  if (bVar2 == 2) {
    this->m_samples = 0x480;
  }
  else {
    if (bVar2 == 3) {
      this->m_samples = 0x180;
      iVar6 = (((uint)uVar1 * 12000) / uVar8 + uVar7) * 4;
      goto LAB_001bd789;
    }
    this->m_samples = 0x480;
    uVar8 = uVar8 << (sbyte)uVar5;
  }
  iVar6 = ((uint)uVar1 * 0x23280) / uVar8 + uVar7;
LAB_001bd789:
  this->m_frame_size = iVar6;
  return iVar6;
}

Assistant:

int MP3Codec::mp3DecodeFrame(uint8_t* buff, const uint8_t* end)
{
    // int sample_rate, frame_size, mpeg25, padding;
    // int sample_rate_index, bitrate_index;
    int mpeg25, lsf;
    if (end - buff < 4)
        return 0;
    const uint32_t header = my_ntohl(*reinterpret_cast<uint32_t*>(buff));
    if (header & (1 << 20))
    {
        lsf = (header & (1 << 19)) ? 0 : 1;
        mpeg25 = 0;
    }
    else
    {
        lsf = 1;
        mpeg25 = 1;
    }

    m_layer = static_cast<int8_t>(4 - ((header >> 17) & 3));
    if (m_layer == 4)
        return 0;
    /* extract frequency */
    m_sample_rate_index = static_cast<uint8_t>((header >> 10) & 3);
    if (m_sample_rate_index == 3)
        return 0;  // invalid sample rate
    m_sample_rate = ff_mpa_freq_tab[m_sample_rate_index] >> (lsf + mpeg25);
    m_sample_rate_index += 3 * (lsf + mpeg25);
    // error_protection = ((header >> 16) & 1) ^ 1;

    m_bitrate_index = static_cast<uint8_t>((header >> 12) & 0xf);
    if (m_bitrate_index == 15)
        return 0;  // invalid bitrate index
    const auto padding = static_cast<uint8_t>((header >> 9) & 1);
    // extension = (header >> 8) & 1;
    m_mode = static_cast<uint8_t>((header >> 6) & 3);
    m_mode_ext = static_cast<uint8_t>((header >> 4) & 3);
    // copyright = (header >> 3) & 1;
    // original = (header >> 2) & 1;
    // emphasis = header & 3;

    m_nb_channels = (m_mode == MPA_MONO) ? 1 : 2;

    if (m_bitrate_index != 0)
    {
        m_frame_size = ff_mpa_bitrate_tab[lsf][m_layer - 1][m_bitrate_index];
        m_bit_rate = m_frame_size * 1000;
        switch (m_layer)
        {
        case 1:
            m_samples = 384;
            m_frame_size = (m_frame_size * 12000) / m_sample_rate;
            m_frame_size = (m_frame_size + padding) * 4;
            break;
        case 2:
            m_samples = 1152;
            m_frame_size = (m_frame_size * 144000) / m_sample_rate;
            m_frame_size += padding;
            break;
        default:
        case 3:
            m_samples = 1152;
            m_frame_size = (m_frame_size * 144000) / (m_sample_rate << lsf);
            m_frame_size += padding;
            break;
        }
    }
    else
    {
        /* if no frame size computed, signal it */
        return 0;
    }
    return m_frame_size;
}